

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclPlatform.cpp
# Opt level: O2

Value __thiscall xmrig::OclPlatform::toJSON(OclPlatform *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  long in_RDX;
  long extraout_RDX;
  Value VVar1;
  undefined1 auStack_a8 [32];
  StringRefType local_88;
  StringRefType local_78;
  StringRefType local_68;
  StringRefType local_58;
  StringRefType local_48;
  StringRefType local_38;
  
  if ((doc->
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ).data_.n.i64 == 0) {
    this->m_id = (cl_platform_id)0x0;
    this->m_index = 0;
  }
  else {
    allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RDX + 0x10);
    this->m_id = (cl_platform_id)0x0;
    this->m_index = 0;
    *(undefined2 *)((long)&this->m_index + 6) = 3;
    local_38.s = "index";
    local_38.length = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_long>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)this,&local_38,
               (unsigned_long)
               (doc->
               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ).data_.s.str,allocator);
    local_48.s = "profile";
    local_48.length = 7;
    profile((OclPlatform *)auStack_a8);
    String::toJSON((String *)(auStack_a8 + 0x10),(Document *)auStack_a8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,&local_48,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)(auStack_a8 + 0x10),allocator);
    String::~String((String *)auStack_a8);
    local_58.s = "version";
    local_58.length = 7;
    version((OclPlatform *)auStack_a8);
    String::toJSON((String *)(auStack_a8 + 0x10),(Document *)auStack_a8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,&local_58,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)(auStack_a8 + 0x10),allocator);
    String::~String((String *)auStack_a8);
    local_68.s = "name";
    local_68.length = 4;
    name((OclPlatform *)auStack_a8);
    String::toJSON((String *)(auStack_a8 + 0x10),(Document *)auStack_a8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,&local_68,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)(auStack_a8 + 0x10),allocator);
    String::~String((String *)auStack_a8);
    local_78.s = "vendor";
    local_78.length = 6;
    vendor((OclPlatform *)auStack_a8);
    String::toJSON((String *)(auStack_a8 + 0x10),(Document *)auStack_a8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,&local_78,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)(auStack_a8 + 0x10),allocator);
    String::~String((String *)auStack_a8);
    local_88.s = "extensions";
    local_88.length = 10;
    extensions((OclPlatform *)auStack_a8);
    String::toJSON((String *)(auStack_a8 + 0x10),(Document *)auStack_a8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,&local_88,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)(auStack_a8 + 0x10),allocator);
    String::~String((String *)auStack_a8);
    in_RDX = extraout_RDX;
  }
  VVar1.data_.s.str = (Ch *)in_RDX;
  VVar1.data_.n = (Number)this;
  return (Value)VVar1.data_;
}

Assistant:

rapidjson::Value xmrig::OclPlatform::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    if (!isValid()) {
        return Value(kNullType);
    }

    Value out(kObjectType);
    out.AddMember("index",      static_cast<uint64_t>(index()), allocator);
    out.AddMember("profile",    profile().toJSON(doc), allocator);
    out.AddMember("version",    version().toJSON(doc), allocator);
    out.AddMember("name",       name().toJSON(doc), allocator);
    out.AddMember("vendor",     vendor().toJSON(doc), allocator);
    out.AddMember("extensions", extensions().toJSON(doc), allocator);

    return out;
}